

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR set_assign_pos(lyxp_set *set,lyd_node *root,lyxp_node_type root_type)

{
  lyxp_set_node *plVar1;
  lysc_node *plVar2;
  uint32_t uVar3;
  uint uVar4;
  lyxp_set_node *plVar5;
  lyd_node_inner *plVar6;
  lyd_node_inner *plVar7;
  lyd_node_inner *plVar8;
  lys_module *plVar9;
  lyd_node_inner *plVar10;
  lyd_node_inner *plVar11;
  uint32_t uVar12;
  lyd_node_inner *plVar13;
  lyd_node_inner *plVar14;
  ulong uVar15;
  uint32_t uVar16;
  bool bVar17;
  
  uVar4 = set->used;
  if (uVar4 != 0) {
    uVar15 = 0;
    uVar12 = 0;
    plVar6 = (lyd_node_inner *)0x0;
    do {
      plVar5 = (set->val).nodes;
      if (plVar5[uVar15].pos == 0) {
        plVar1 = plVar5 + uVar15;
        if (plVar1->type - LYXP_NODE_ELEM < 2) {
          plVar8 = (lyd_node_inner *)plVar1->node;
        }
        else {
          if (plVar1->type != LYXP_NODE_META) goto LAB_001aa7cf;
          plVar8 = *(lyd_node_inner **)plVar1->node;
          if (plVar8 == (lyd_node_inner *)0x0) {
            ly_log(root->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                   0x610);
            return LY_EINT;
          }
        }
        if (root->prev->next != (lyd_node *)0x0) {
          __assert_fail("prev && prev_pos && !root->prev->next",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x5b9,
                        "uint32_t get_node_pos(const struct lyd_node *, enum lyxp_node_type, const struct lyd_node *, enum lyxp_node_type, const struct lyd_node **, uint32_t *)"
                       );
        }
        plVar10 = plVar6;
        if (plVar6 == (lyd_node_inner *)0x0) {
          uVar16 = 1;
          plVar6 = (lyd_node_inner *)0x0;
          plVar10 = (lyd_node_inner *)0x0;
          plVar13 = (lyd_node_inner *)0x0;
          plVar11 = (lyd_node_inner *)root;
          goto LAB_001aa6a9;
        }
        do {
          plVar11 = plVar10;
          plVar10 = (plVar11->field_0).node.parent;
        } while (plVar10 != (lyd_node_inner *)0x0);
        plVar10 = plVar6;
        plVar14 = (lyd_node_inner *)0x0;
        uVar16 = uVar12;
LAB_001aa6e1:
        do {
          plVar13 = plVar10;
          if (plVar14 != (lyd_node_inner *)0x0) {
            plVar13 = plVar14;
          }
          if (plVar10 == (lyd_node_inner *)0x0) {
            plVar13 = plVar14;
          }
          if (((root_type == LYXP_NODE_ROOT_CONFIG) &&
              (plVar2 = (plVar13->field_0).node.schema, plVar2 != (lysc_node *)0x0)) &&
             ((plVar2->flags & 2) != 0)) {
LAB_001aa733:
            if (plVar13 != plVar11) {
              plVar14 = (lyd_node_inner *)(plVar13->field_0).node.next;
              if (plVar14 == (lyd_node_inner *)0x0) {
                plVar13 = (plVar13->field_0).node.parent;
                do {
                  plVar7 = (plVar13->field_0).node.parent;
                  if (plVar7 == (plVar11->field_0).node.parent) {
                    plVar13 = (lyd_node_inner *)0x0;
                    goto LAB_001aa763;
                  }
                  plVar14 = (lyd_node_inner *)(plVar13->field_0).node.next;
                  plVar13 = plVar7;
                } while (plVar14 == (lyd_node_inner *)0x0);
              }
              goto LAB_001aa6e1;
            }
LAB_001aa763:
            plVar11 = (lyd_node_inner *)(plVar11->field_0).node.next;
LAB_001aa6a9:
            bVar17 = true;
            plVar7 = plVar6;
            plVar14 = plVar11;
            if (plVar11 != (lyd_node_inner *)0x0) goto LAB_001aa6e1;
          }
          else {
            if (plVar13 != plVar8) {
              uVar16 = uVar16 + 1;
              if (((plVar13 == (lyd_node_inner *)0x0) ||
                  ((plVar2 = (plVar13->field_0).node.schema, plVar2 != (lysc_node *)0x0 &&
                   ((plVar2->nodetype & 0x711) == 0)))) ||
                 (plVar14 = (lyd_node_inner *)plVar13->child,
                 (lyd_node_inner *)plVar13->child == (lyd_node_inner *)0x0)) goto LAB_001aa733;
              goto LAB_001aa6e1;
            }
            bVar17 = false;
            plVar7 = plVar6;
          }
          plVar6 = plVar8;
          uVar3 = uVar16;
          if (!bVar17) goto LAB_001aa7c7;
          uVar16 = 1;
          bVar17 = plVar10 != (lyd_node_inner *)0x0;
          plVar6 = (lyd_node_inner *)root;
          plVar10 = (lyd_node_inner *)root;
          plVar11 = (lyd_node_inner *)root;
          plVar14 = plVar13;
        } while (bVar17);
        plVar2 = (plVar8->field_0).node.schema;
        if (plVar2 == (lysc_node *)0x0) {
          plVar9 = (lys_module *)((long)&plVar8[1].field_0 + 0x30);
        }
        else {
          plVar9 = plVar2->module;
        }
        uVar16 = 0;
        ly_log(plVar9->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
               0x5e8);
        plVar5 = (set->val).nodes;
        uVar4 = set->used;
        plVar6 = plVar7;
        uVar3 = uVar12;
LAB_001aa7c7:
        uVar12 = uVar3;
        plVar5[uVar15].pos = uVar16;
      }
LAB_001aa7cf:
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar4);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
set_assign_pos(struct lyxp_set *set, const struct lyd_node *root, enum lyxp_node_type root_type)
{
    const struct lyd_node *prev = NULL, *tmp_node;
    uint32_t i, tmp_pos = 0;

    for (i = 0; i < set->used; ++i) {
        if (!set->val.nodes[i].pos) {
            tmp_node = NULL;
            switch (set->val.nodes[i].type) {
            case LYXP_NODE_META:
                tmp_node = set->val.meta[i].meta->parent;
                if (!tmp_node) {
                    LOGINT_RET(root->schema->module->ctx);
                }
            /* fall through */
            case LYXP_NODE_ELEM:
            case LYXP_NODE_TEXT:
                if (!tmp_node) {
                    tmp_node = set->val.nodes[i].node;
                }
                set->val.nodes[i].pos = get_node_pos(tmp_node, set->val.nodes[i].type, root, root_type, &prev, &tmp_pos);
                break;
            default:
                /* all roots have position 0 */
                break;
            }
        }
    }

    return LY_SUCCESS;
}